

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::QuerySurfaceCase::checkNonPbufferAttributes
          (QuerySurfaceCase *this,EGLDisplay display,EGLSurface surface)

{
  char *__s;
  MessageBuilder *pMVar1;
  Enum<int,_2UL> EVar2;
  MessageBuilder local_3a8;
  int local_224;
  GetNameFunc local_220;
  int local_218;
  Enum<int,_2UL> local_210;
  MessageBuilder local_200;
  int local_80;
  EGLint error;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string name;
  int local_40;
  EGLint attribute;
  int ndx;
  EGLint value;
  TestLog *log;
  Library *pLStack_28;
  EGLint uninitializedMagicValue;
  Library *egl;
  EGLSurface surface_local;
  EGLDisplay display_local;
  QuerySurfaceCase *this_local;
  
  egl = (Library *)surface;
  surface_local = display;
  display_local = this;
  pLStack_28 = EglTestContext::getLibrary
                         ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  log._4_4_ = 0xffffffd6;
  _ndx = tcu::TestContext::getLog
                   ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx);
  attribute = -0x2a;
  local_40 = 0;
  while( true ) {
    if (4 < local_40) {
      return;
    }
    name.field_2._12_4_ = checkNonPbufferAttributes::pbufferAttribs[local_40];
    __s = eglu::getSurfaceAttribName(checkNonPbufferAttributes::pbufferAttribs[local_40]);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,__s,&local_69);
    std::allocator<char>::~allocator(&local_69);
    (*pLStack_28->_vptr_Library[0x2b])
              (pLStack_28,surface_local,egl,(ulong)(uint)name.field_2._12_4_,&attribute);
    local_80 = (*pLStack_28->_vptr_Library[0x1f])();
    if (local_80 == 0x3000) {
      if (attribute != -0x2a) {
        tcu::TestLog::operator<<(&local_3a8,_ndx,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar1 = tcu::MessageBuilder::operator<<
                           (&local_3a8,
                            (char (*) [61])
                            "    Fail, return value contents were modified when querying ");
        pMVar1 = tcu::MessageBuilder::operator<<
                           (pMVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_68);
        pMVar1 = tcu::MessageBuilder::operator<<
                           (pMVar1,(char (*) [29])" from a non-pbuffer surface.");
        tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3a8);
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Illegal modification of return value");
      }
      local_224 = 0;
    }
    else {
      tcu::TestLog::operator<<(&local_200,_ndx,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<(&local_200,(char (*) [20])"    Fail, querying ");
      pMVar1 = tcu::MessageBuilder::operator<<
                         (pMVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_68);
      pMVar1 = tcu::MessageBuilder::operator<<
                         (pMVar1,(char (*) [69])
                                 " from a non-pbuffer surface should not result in an error, received "
                         );
      EVar2 = eglu::getErrorStr(local_80);
      local_220 = EVar2.m_getName;
      local_218 = EVar2.m_value;
      local_210.m_getName = local_220;
      local_210.m_value = local_218;
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_210);
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_200);
      tcu::TestContext::setTestResult
                ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Illegal error condition");
      local_224 = 2;
    }
    std::__cxx11::string::~string((string *)local_68);
    if (local_224 != 0) break;
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

void QuerySurfaceCase::checkNonPbufferAttributes (EGLDisplay display, EGLSurface surface)
{
	const Library&	egl						= m_eglTestCtx.getLibrary();
	const EGLint	uninitializedMagicValue	= -42;
	tcu::TestLog&	log						= m_testCtx.getLog();
	EGLint			value					= uninitializedMagicValue;

	static const EGLint pbufferAttribs[] =
	{
		EGL_LARGEST_PBUFFER,
		EGL_TEXTURE_FORMAT,
		EGL_TEXTURE_TARGET,
		EGL_MIPMAP_TEXTURE,
		EGL_MIPMAP_LEVEL,
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pbufferAttribs); ndx++)
	{
		const EGLint		attribute	= pbufferAttribs[ndx];
		const std::string	name		= eglu::getSurfaceAttribName(pbufferAttribs[ndx]);

		egl.querySurface(display, surface, attribute, &value);

		{
			const EGLint	error	= egl.getError();

			if (error != EGL_SUCCESS)
			{
				log << TestLog::Message << "    Fail, querying " << name << " from a non-pbuffer surface should not result in an error, received "
					<< eglu::getErrorStr(error) << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Illegal error condition");
				break;
			}
		}

		// "For a window or pixmap surface, the contents of value are not modified."
		if (value != uninitializedMagicValue)
		{
			log << TestLog::Message << "    Fail, return value contents were modified when querying " << name << " from a non-pbuffer surface." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Illegal modification of return value");
		}
	}
}